

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder.cc
# Opt level: O2

InputVertexId __thiscall S2Builder::AddVertex(S2Builder *this,S2Point *v)

{
  pointer pVVar1;
  bool bVar2;
  
  pVVar1 = (this->input_vertices_).
           super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if ((this->input_vertices_).super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>
      ._M_impl.super__Vector_impl_data._M_start != pVVar1) {
    bVar2 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator!=
                      ((BasicVector<Vector3,_double,_3UL> *)v,pVVar1 + -1);
    if (!bVar2) goto LAB_001f0c77;
  }
  std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::push_back
            (&this->input_vertices_,v);
LAB_001f0c77:
  return (int)(((long)(this->input_vertices_).
                      super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl
                      .super__Vector_impl_data._M_finish -
               (long)(this->input_vertices_).
                     super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
                     super__Vector_impl_data._M_start) / 0x18) + -1;
}

Assistant:

S2Builder::InputVertexId S2Builder::AddVertex(const S2Point& v) {
  // Remove duplicate vertices that follow the pattern AB, BC, CD.  If we want
  // to do anything more sophisticated, either use a ValueLexicon, or sort the
  // vertices once they have all been added, remove duplicates, and update the
  // edges.
  if (input_vertices_.empty() || v != input_vertices_.back()) {
    input_vertices_.push_back(v);
  }
  return input_vertices_.size() - 1;
}